

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.hpp
# Opt level: O0

void __thiscall katherine::device::device(device *this,string *addr)

{
  int rc;
  undefined8 uVar1;
  system_error *this_00;
  int res;
  string *addr_local;
  device *this_local;
  
  this->_vptr_device = (_func_int **)&PTR__device_0010cc98;
  uVar1 = std::__cxx11::string::c_str();
  rc = katherine_device_init(&this->dev_,uVar1);
  if (rc != 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x10);
    system_error::system_error(this_00,rc);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  return;
}

Assistant:

device(std::string addr)
    {
        int res = katherine_device_init(&dev_, addr.c_str());
        if (res != 0) {
            throw katherine::system_error{res};
        }
    }